

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O3

timestamp_t __thiscall
duckdb::DateTruncBinaryOperator::Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t>
          (DateTruncBinaryOperator *this,string_t specifier,timestamp_t date)

{
  DatePartSpecifier DVar1;
  bool bVar2;
  date_t dVar3;
  timestamp_t input;
  dtime_t dVar4;
  NotImplementedException *this_00;
  long lVar5;
  undefined1 auVar6 [16];
  date_t date_1;
  int32_t min;
  int32_t micros;
  int32_t sec;
  timestamp_t result;
  dtime_t time;
  date_t local_90;
  int32_t local_8c;
  int local_88;
  int32_t local_84;
  timestamp_t local_80;
  string local_78;
  string local_58;
  undefined8 local_38;
  long local_30;
  
  input.value = specifier.value._8_8_;
  local_30 = specifier.value._0_8_;
  lVar5 = local_30;
  if ((uint)this < 0xd) {
    lVar5 = (long)&local_38 + 4;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = this;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,lVar5,((ulong)this & 0xffffffff) + lVar5);
  DVar1 = GetDatePartSpecifier(&local_58);
  bVar2 = Value::IsFinite<duckdb::timestamp_t>(input);
  if (bVar2) {
    switch(DVar1) {
    case BEGIN_BIGINT:
      dVar3 = Timestamp::GetDate(input);
      input = DateTrunc::YearOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar3);
      break;
    case MONTH:
      dVar3 = Timestamp::GetDate(input);
      input = DateTrunc::MonthOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar3);
      break;
    case DAY:
    case DOW:
    case ISODOW:
    case DOY:
    case JULIAN_DAY:
      dVar3 = Timestamp::GetDate(input);
      input = Timestamp::FromDatetime(dVar3,(dtime_t)0x0);
      break;
    case DECADE:
      dVar3 = Timestamp::GetDate(input);
      input = DateTrunc::DecadeOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar3);
      break;
    case CENTURY:
      dVar3 = Timestamp::GetDate(input);
      input = DateTrunc::CenturyOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar3);
      break;
    case MILLENNIUM:
      dVar3 = Timestamp::GetDate(input);
      input = DateTrunc::MillenniumOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar3);
      break;
    case MICROSECONDS:
      break;
    case MILLISECONDS:
      Timestamp::Convert(input,&local_90,(dtime_t *)&local_78);
      Time::Convert((dtime_t)local_78._M_dataplus._M_p,(int32_t *)&local_80,&local_8c,&local_84,
                    &local_88);
      local_88 = (local_88 / 1000) * 1000;
      dVar4 = Time::FromTime((int32_t)local_80.value,local_8c,local_84,local_88);
      input = Timestamp::FromDatetime(local_90,dVar4);
      break;
    case SECOND:
    case BEGIN_DOUBLE:
      Timestamp::Convert(input,&local_90,(dtime_t *)&local_78);
      Time::Convert((dtime_t)local_78._M_dataplus._M_p,(int32_t *)&local_80,&local_8c,&local_84,
                    &local_88);
      dVar4 = Time::FromTime((int32_t)local_80.value,local_8c,local_84,0);
      input = Timestamp::FromDatetime(local_90,dVar4);
      break;
    case MINUTE:
      Timestamp::Convert(input,&local_90,(dtime_t *)&local_78);
      Time::Convert((dtime_t)local_78._M_dataplus._M_p,(int32_t *)&local_80,&local_8c,&local_84,
                    &local_88);
      dVar4 = Time::FromTime((int32_t)local_80.value,local_8c,0,0);
      input = Timestamp::FromDatetime(local_90,dVar4);
      break;
    case HOUR:
      Timestamp::Convert(input,&local_90,(dtime_t *)&local_78);
      Time::Convert((dtime_t)local_78._M_dataplus._M_p,(int32_t *)&local_80,&local_8c,&local_84,
                    &local_88);
      dVar4 = Time::FromTime((int32_t)local_80.value,0,0,0);
      input = Timestamp::FromDatetime(local_90,dVar4);
      break;
    case WEEK:
    case YEARWEEK:
      input = DateTrunc::WeekOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(input);
      break;
    case ISOYEAR:
      dVar3 = Timestamp::GetDate(input);
      input = DateTrunc::ISOYearOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar3);
      break;
    case QUARTER:
      dVar3 = Timestamp::GetDate(input);
      input = DateTrunc::QuarterOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar3);
      break;
    default:
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Specifier type not implemented for DATETRUNC","");
      NotImplementedException::NotImplementedException(this_00,&local_78);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    bVar2 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(input,&local_80,false);
    if (!bVar2) {
      auVar6 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                (&local_78,(duckdb *)input.value,(timestamp_t)auVar6._8_8_);
      InvalidInputException::InvalidInputException(auVar6._0_8_,&local_78);
      __cxa_throw(auVar6._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    input.value = CONCAT44(local_80.value._4_4_,(int32_t)local_80.value);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return (timestamp_t)input.value;
}

Assistant:

static inline TR Operation(TA specifier, TB date) {
		return TruncateElement<TB, TR>(GetDatePartSpecifier(specifier.GetString()), date);
	}